

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::updateVelocity
          (MLNodeLaplacian *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *sol)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long *plVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  FabType FVar16;
  uint uVar17;
  EBFArrayBoxFactory *this_00;
  int *piVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  void *__s;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  long local_308;
  Box local_2cc;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  undefined4 local_284;
  long local_280;
  MLNodeLaplacian *local_278;
  FabArray<amrex::FArrayBox> *local_270;
  FabArray<amrex::EBCellFlagFab> *local_268;
  long local_260;
  ulong local_258;
  long local_250;
  int local_248;
  int local_244;
  Array4<double> local_240;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_200;
  undefined8 *local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  Array4<const_double> local_1d8;
  double local_198;
  double local_190;
  double local_188;
  Real facz;
  Real facy;
  Real facx;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_168;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_160;
  long local_158;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  MFIter mfi;
  Array4<const_double> local_70;
  
  lVar19 = 0;
  local_278 = this;
  local_200 = vel;
  local_160 = sol;
  do {
    if ((local_278->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels <= lVar19) {
      return;
    }
    local_1f8 = *(undefined8 **)
                 &(local_278->m_sigma).
                  super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar19].
                  super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                  .
                  super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
    ;
    lVar20 = *(long *)&(local_278->super_MLNodeLinOp).super_MLLinOp.m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar19].
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_1e0 = *(double *)(lVar20 + 0x38);
    local_1e8 = *(double *)(lVar20 + 0x40);
    local_1f0 = *(double *)(lVar20 + 0x48);
    plVar10 = *(long **)&(local_278->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar19].
                         super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ;
    lVar20 = *plVar10;
    local_284 = (undefined4)CONCAT71((int7)((ulong)plVar10 >> 8),1);
    if (lVar20 == 0) {
      local_268 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      local_270 = (FabArray<amrex::FArrayBox> *)0x0;
    }
    else {
      this_00 = (EBFArrayBoxFactory *)
                __dynamic_cast(lVar20,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
      local_268 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      local_270 = (FabArray<amrex::FArrayBox> *)0x0;
      if (this_00 != (EBFArrayBoxFactory *)0x0) {
        local_268 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
        local_270 = &EBFArrayBoxFactory::getVolFrac(this_00)->super_FabArray<amrex::FArrayBox>;
        local_284 = 0;
      }
    }
    local_168._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (local_278->m_integral).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    MFIter::MFIter(&mfi,(FabArrayBase *)
                        (local_200->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar19],true);
    facx = local_1e0 * 0.25;
    facy = local_1e8 * 0.25;
    facz = local_1f0 * 0.25;
    local_188 = local_1e0 * -0.25;
    local_190 = local_1e8 * -0.25;
    local_198 = local_1f0 * -0.25;
    local_158 = lVar19;
    while (lVar19 = local_158, mfi.currentIndex < mfi.endIndex) {
      MFIter::tilebox(&local_2cc,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_240,
                 &(local_200->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar19]->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1d8,
                 &(local_160->
                  super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar19]->
                  super_FabArray<amrex::FArrayBox>,&mfi);
      if ((char)local_284 == '\0') {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_150,(FabArray<amrex::FArrayBox> *)*local_1f8,&mfi);
        piVar18 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar18 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        FVar16 = EBCellFlagFab::getType
                           ((local_268->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar18],&local_2cc);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_70,local_270,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,
                   (FabArray<amrex::FArrayBox> *)
                   local_168._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
        iVar15 = local_2cc.bigend.vect[2];
        iVar14 = local_2cc.bigend.vect[1];
        iVar13 = local_2cc.bigend.vect[0];
        iVar12 = local_2cc.smallend.vect[2];
        iVar11 = local_2cc.smallend.vect[1];
        iVar31 = local_2cc.smallend.vect[0];
        if (FVar16 == singlevalued) {
          local_260 = (long)local_2cc.smallend.vect[0];
          local_248 = local_2cc.smallend.vect[1];
          local_244 = local_2cc.bigend.vect[2];
          uVar17 = local_2cc.smallend.vect[2];
          while (uVar26 = uVar17, (int)uVar26 <= local_2cc.bigend.vect[2]) {
            uVar17 = uVar26 + 1;
            local_280 = CONCAT44(local_280._4_4_,uVar17);
            iVar31 = local_2cc.smallend.vect[1];
            while (local_258 = (ulong)uVar26, iVar31 <= local_2cc.bigend.vect[1]) {
              lVar28 = (long)iVar31;
              lVar27 = (long)(int)uVar26;
              lVar23 = (iVar31 - local_1d8.begin.y) * local_1d8.jstride;
              lVar25 = (int)(uVar26 - local_1d8.begin.z) * local_1d8.kstride;
              iVar31 = iVar31 + 1;
              local_250 = CONCAT44(local_250._4_4_,iVar31);
              lVar20 = (iVar31 - local_1d8.begin.y) * local_1d8.jstride;
              lVar21 = (int)(uVar17 - local_1d8.begin.z) * local_1d8.kstride;
              lVar35 = (lVar28 - local_150.begin.y) * local_150.jstride;
              lVar36 = (lVar27 - local_150.begin.z) * local_150.kstride;
              lVar34 = (lVar28 - local_110.begin.y) * local_110.jstride;
              lVar22 = (lVar27 - local_110.begin.z) * local_110.kstride;
              local_2a8 = local_110.nstride * 0x40;
              lVar38 = (lVar28 - local_240.begin.y) * local_240.jstride;
              lVar33 = (lVar27 - local_240.begin.z) * local_240.kstride;
              local_290 = (long)local_150.begin.x;
              local_298 = (long)local_110.begin.x;
              local_2a0 = local_110.nstride * 0x38;
              local_2b0 = local_110.nstride * 0x30;
              lVar19 = local_260;
              while (lVar19 <= local_2cc.bigend.vect[0]) {
                dVar41 = local_70.p
                         [(lVar28 - local_70.begin.y) * local_70.jstride +
                          (lVar27 - local_70.begin.z) * local_70.kstride +
                          (lVar19 - local_70.begin.x)];
                if ((dVar41 != 0.0) || (NAN(dVar41))) {
                  lVar29 = lVar19 - local_1d8.begin.x;
                  dVar2 = local_1d8.p[lVar23 + lVar29 + lVar25];
                  lVar32 = (long)((int)(lVar19 + 1) - local_1d8.begin.x);
                  dVar3 = local_1d8.p[lVar23 + lVar29 + lVar21];
                  dVar4 = local_1d8.p[lVar23 + lVar32 + lVar25];
                  dVar5 = local_1d8.p[lVar20 + lVar29 + lVar25];
                  dVar6 = local_1d8.p[lVar20 + lVar32 + lVar25];
                  dVar7 = local_1d8.p[lVar23 + lVar32 + lVar21];
                  dVar8 = local_1d8.p[lVar20 + lVar29 + lVar21];
                  dVar9 = local_1d8.p[lVar20 + lVar32 + lVar21];
                  dVar40 = ((dVar9 - dVar8) - dVar7) + dVar3;
                  dVar43 = ((((dVar6 + dVar40) - dVar5) - dVar4) + dVar2) / dVar41;
                  dVar42 = ((((((dVar7 + (dVar9 - dVar8)) - dVar3) - dVar6) + dVar5) - dVar4) +
                           dVar2) / dVar41;
                  dVar39 = ((((((dVar8 + dVar9) - dVar7) - dVar3) - dVar6) - dVar5) + dVar4 + dVar2)
                           / dVar41;
                  dVar41 = (((dVar40 - dVar6) + dVar5 + dVar4) - dVar2) / dVar41;
                  lVar29 = lVar19 - local_290;
                  lVar30 = lVar19 - local_298;
                  lVar32 = lVar19 - local_240.begin.x;
                  local_240.p[lVar38 + lVar33 + lVar32] =
                       local_240.p[lVar38 + lVar33 + lVar32] -
                       local_150.p[lVar35 + lVar36 + lVar29] * local_1e0 *
                       (local_110.p[lVar34 + lVar22 + lVar30 + local_110.nstride * 8] * dVar41 +
                       local_110.p[lVar34 + lVar22 + lVar30 + local_110.nstride * 2] * 0.5 * dVar42
                       + local_110.p[lVar34 + lVar22 + lVar30 + local_110.nstride] * 0.5 * dVar43 +
                         (((((((dVar4 - dVar2) - dVar5) + dVar6) - dVar3) + dVar7) - dVar8) + dVar9)
                         * 0.25);
                  local_240.p[lVar38 + lVar33 + lVar32 + local_240.nstride] =
                       local_240.p[lVar38 + lVar33 + lVar32 + local_240.nstride] -
                       local_150.p[lVar35 + lVar36 + lVar29] * local_1e8 *
                       (local_110.p[lVar34 + lVar22 + lVar30 + local_110.nstride * 7] * dVar41 +
                       local_110.p[lVar34 + lVar22 + lVar30 + local_110.nstride * 2] * 0.5 * dVar39
                       + local_110.p[lVar34 + lVar22 + lVar30] * 0.5 * dVar43 +
                         (((((-dVar2 - dVar4) + dVar5 + dVar6) - dVar3) - dVar7) + dVar8 + dVar9) *
                         0.25);
                  local_240.p[lVar38 + lVar33 + lVar32 + local_240.nstride * 2] =
                       local_240.p[lVar38 + lVar33 + lVar32 + local_240.nstride * 2] -
                       local_150.p[lVar35 + lVar36 + lVar29] * local_1f0 *
                       (dVar41 * local_110.p[lVar34 + lVar22 + lVar30 + local_110.nstride * 6] +
                       local_110.p[lVar34 + lVar22 + lVar30 + local_110.nstride] * 0.5 * dVar39 +
                       local_110.p[lVar34 + lVar22 + lVar30] * 0.5 * dVar42 +
                       ((((-dVar2 - dVar4) - dVar5) - dVar6) + dVar3 + dVar7 + dVar8 + dVar9) * 0.25
                       );
                  lVar19 = lVar19 + 1;
                }
                else {
                  lVar29 = lVar19 - local_240.begin.x;
                  local_240.p[lVar38 + lVar33 + lVar29 + local_240.nstride * 2] = 0.0;
                  local_240.p[lVar38 + lVar33 + lVar29 + local_240.nstride] = 0.0;
                  local_240.p[lVar38 + lVar33 + lVar29] = 0.0;
                  lVar19 = lVar19 + 1;
                }
              }
            }
          }
        }
        else {
          if (FVar16 != covered) goto LAB_005611cd;
          lVar23 = (long)local_2cc.smallend.vect[0];
          lVar19 = (long)local_2cc.smallend.vect[1];
          uVar17 = local_2cc.bigend.vect[0] - local_2cc.smallend.vect[0];
          local_308 = 0;
          for (lVar20 = 0; uVar26 = iVar12, lVar20 != 3; lVar20 = lVar20 + 1) {
            for (; (int)uVar26 <= iVar15; uVar26 = uVar26 + 1) {
              lVar35 = local_240.jstride * 8;
              __s = (void *)((long)local_240.p +
                            local_240.nstride * local_308 +
                            (lVar19 - local_240.begin.y) * lVar35 +
                            (int)(uVar26 - local_240.begin.z) * local_240.kstride * 8 +
                            (long)local_240.begin.x * -8 + lVar23 * 8);
              for (iVar24 = iVar11; iVar24 <= iVar14; iVar24 = iVar24 + 1) {
                if (iVar31 <= iVar13) {
                  memset(__s,0,(ulong)uVar17 * 8 + 8);
                }
                __s = (void *)((long)__s + lVar35);
              }
            }
            local_308 = local_308 + 8;
          }
        }
      }
      else {
LAB_005611cd:
        if ((FabArray<amrex::FArrayBox> *)*local_1f8 == (FabArray<amrex::FArrayBox> *)0x0) {
          dVar41 = local_278->m_const_sigma;
          local_2a0 = (long)local_2cc.smallend.vect[1];
          local_298 = CONCAT44(local_298._4_4_,local_2cc.bigend.vect[2]);
          local_2b0 = (long)local_2cc.smallend.vect[0] * 8;
          local_2a8 = CONCAT44(local_2a8._4_4_,local_2cc.smallend.vect[2] + 1);
          lVar19 = (long)local_2cc.smallend.vect[2];
          while ((int)lVar19 <= local_2cc.bigend.vect[2]) {
            local_290 = lVar19 + 1;
            lVar23 = (long)local_240.begin.x;
            lVar36 = (lVar19 - local_240.begin.z) * local_240.kstride;
            lVar20 = (long)((int)local_2a8 - local_1d8.begin.z) * local_1d8.kstride * 8 +
                     (long)local_1d8.begin.x * -8;
            lVar35 = (lVar19 - local_1d8.begin.z) * local_1d8.kstride * 8 +
                     (long)local_1d8.begin.x * -8;
            lVar19 = local_2a0;
            while (lVar19 <= local_2cc.bigend.vect[1]) {
              if (local_2cc.bigend.vect[0] < local_2cc.smallend.vect[0]) {
                lVar19 = lVar19 + 1;
              }
              else {
                lVar22 = lVar19 + 1;
                lVar34 = (lVar19 - local_240.begin.y) * local_240.jstride * 8;
                lVar28 = lVar34 + lVar36 * 8 + lVar23 * -8 + local_2b0;
                lVar38 = lVar34 + local_240.nstride * 8 + lVar36 * 8 + lVar23 * -8 + local_2b0;
                lVar34 = lVar34 + local_240.nstride * 0x10 + lVar36 * 8 + lVar23 * -8 + local_2b0;
                lVar33 = (lVar19 - local_1d8.begin.y) * local_1d8.jstride * 8;
                lVar27 = lVar33 + lVar20 + local_2b0 + 8;
                lVar33 = lVar33 + lVar35 + local_2b0 + 8;
                lVar25 = (long)((int)lVar22 - local_1d8.begin.y) * local_1d8.jstride * 8;
                lVar21 = lVar25 + lVar20 + local_2b0;
                lVar25 = lVar25 + lVar35 + local_2b0;
                lVar29 = 0;
                do {
                  *(double *)((long)local_240.p + lVar29 * 8 + lVar28) =
                       (((((((*(double *)((long)local_1d8.p + lVar29 * 8 + lVar33) -
                             *(double *)((long)local_1d8.p + lVar29 * 8 + lVar33 + -8)) -
                            *(double *)((long)local_1d8.p + lVar29 * 8 + lVar25)) +
                           *(double *)((long)local_1d8.p + lVar29 * 8 + lVar25 + 8)) -
                          *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27 + -8)) +
                         *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27)) -
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar21)) +
                       *(double *)((long)local_1d8.p + lVar29 * 8 + lVar21 + 8)) *
                       local_188 * dVar41 + *(double *)((long)local_240.p + lVar29 * 8 + lVar28);
                  *(double *)((long)local_240.p + lVar29 * 8 + lVar38) =
                       (((((-*(double *)((long)local_1d8.p + lVar29 * 8 + lVar33 + -8) -
                           *(double *)((long)local_1d8.p + lVar29 * 8 + lVar33)) +
                           *(double *)((long)local_1d8.p + lVar29 * 8 + lVar25) +
                          *(double *)((long)local_1d8.p + lVar29 * 8 + lVar25 + 8)) -
                         *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27 + -8)) -
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27)) +
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar21) +
                       *(double *)((long)local_1d8.p + lVar29 * 8 + lVar21 + 8)) *
                       local_190 * dVar41 + *(double *)((long)local_240.p + lVar29 * 8 + lVar38);
                  *(double *)((long)local_240.p + lVar29 * 8 + lVar34) =
                       ((((-*(double *)((long)local_1d8.p + lVar29 * 8 + lVar33 + -8) -
                          *(double *)((long)local_1d8.p + lVar29 * 8 + lVar33)) -
                         *(double *)((long)local_1d8.p + lVar29 * 8 + lVar25)) -
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar25 + 8)) +
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27 + -8) +
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27) +
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar21) +
                       *(double *)((long)local_1d8.p + lVar29 * 8 + lVar21 + 8)) *
                       dVar41 * local_198 + *(double *)((long)local_240.p + lVar29 * 8 + lVar34);
                  lVar29 = lVar29 + 1;
                  lVar19 = lVar22;
                } while ((local_2cc.bigend.vect[0] - local_2cc.smallend.vect[0]) + 1 != (int)lVar29)
                ;
              }
            }
            local_2a8 = CONCAT44(local_2a8._4_4_,(int)local_2a8 + 1);
            lVar19 = local_290;
          }
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_150,(FabArray<amrex::FArrayBox> *)*local_1f8,&mfi);
          local_258 = (ulong)local_2cc.smallend.vect[1];
          local_260 = (long)local_2cc.smallend.vect[0] * 8;
          local_2b0 = CONCAT44(local_2b0._4_4_,local_2cc.smallend.vect[2] + 1);
          lVar19 = (long)local_2cc.smallend.vect[2];
          while ((int)lVar19 <= local_2cc.bigend.vect[2]) {
            local_280 = (long)local_150.begin.x;
            local_250 = lVar19 + 1;
            lVar20 = (long)local_240.begin.x;
            lVar36 = (lVar19 - local_240.begin.z) * local_240.kstride;
            lVar23 = (long)((int)local_2b0 - local_1d8.begin.z) * local_1d8.kstride * 8 +
                     (long)local_1d8.begin.x * -8;
            local_2a8 = (long)local_1d8.p + lVar23 + local_260 + 8;
            lVar35 = (lVar19 - local_1d8.begin.z) * local_1d8.kstride * 8 +
                     (long)local_1d8.begin.x * -8;
            local_290 = (long)local_1d8.p + lVar35 + local_260 + 8;
            local_298 = (long)local_240.begin.y;
            local_2a0 = local_240.jstride * 8;
            uVar37 = local_258;
            while ((long)uVar37 <= (long)local_2cc.bigend.vect[1]) {
              if (local_2cc.bigend.vect[0] < local_2cc.smallend.vect[0]) {
                uVar37 = uVar37 + 1;
              }
              else {
                lVar33 = (uVar37 - (long)local_150.begin.y) * local_150.jstride * 8 +
                         (lVar19 - local_150.begin.z) * local_150.kstride * 8 + local_280 * -8 +
                         local_260;
                uVar1 = uVar37 + 1;
                lVar38 = (uVar37 - local_298) * local_2a0;
                lVar22 = lVar38 + lVar36 * 8 + lVar20 * -8 + local_260;
                lVar28 = lVar38 + local_240.nstride * 8 + lVar36 * 8 + lVar20 * -8 + local_260;
                lVar38 = lVar38 + local_240.nstride * 0x10 + lVar36 * 8 + lVar20 * -8 + local_260;
                lVar25 = (uVar37 - (long)local_1d8.begin.y) * local_1d8.jstride * 8;
                lVar21 = local_2a8 + lVar25;
                lVar25 = lVar25 + local_290;
                lVar27 = (long)((int)uVar1 - local_1d8.begin.y) * local_1d8.jstride * 8;
                lVar34 = lVar27 + lVar23 + local_260;
                lVar27 = lVar27 + lVar35 + local_260;
                lVar29 = 0;
                do {
                  *(double *)((long)local_240.p + lVar29 * 8 + lVar22) =
                       *(double *)((long)local_240.p + lVar29 * 8 + lVar22) -
                       *(double *)((long)local_150.p + lVar29 * 8 + lVar33) * facx *
                       (((((((*(double *)(lVar25 + lVar29 * 8) -
                             *(double *)(lVar25 + -8 + lVar29 * 8)) -
                            *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27)) +
                           *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27 + 8)) -
                          *(double *)(lVar21 + -8 + lVar29 * 8)) + *(double *)(lVar21 + lVar29 * 8))
                        - *(double *)((long)local_1d8.p + lVar29 * 8 + lVar34)) +
                       *(double *)((long)local_1d8.p + lVar29 * 8 + lVar34 + 8));
                  *(double *)((long)local_240.p + lVar29 * 8 + lVar28) =
                       *(double *)((long)local_240.p + lVar29 * 8 + lVar28) -
                       *(double *)((long)local_150.p + lVar29 * 8 + lVar33) * facy *
                       (((((-*(double *)(lVar25 + -8 + lVar29 * 8) -
                           *(double *)(lVar25 + lVar29 * 8)) +
                           *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27) +
                          *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27 + 8)) -
                         *(double *)(lVar21 + -8 + lVar29 * 8)) - *(double *)(lVar21 + lVar29 * 8))
                        + *(double *)((long)local_1d8.p + lVar29 * 8 + lVar34) +
                       *(double *)((long)local_1d8.p + lVar29 * 8 + lVar34 + 8));
                  *(double *)((long)local_240.p + lVar29 * 8 + lVar38) =
                       *(double *)((long)local_240.p + lVar29 * 8 + lVar38) -
                       *(double *)((long)local_150.p + lVar29 * 8 + lVar33) * facz *
                       ((((-*(double *)(lVar25 + -8 + lVar29 * 8) - *(double *)(lVar25 + lVar29 * 8)
                          ) - *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27)) -
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar27 + 8)) +
                        *(double *)(lVar21 + -8 + lVar29 * 8) + *(double *)(lVar21 + lVar29 * 8) +
                        *(double *)((long)local_1d8.p + lVar29 * 8 + lVar34) +
                       *(double *)((long)local_1d8.p + lVar29 * 8 + lVar34 + 8));
                  lVar29 = lVar29 + 1;
                  uVar37 = uVar1;
                } while ((local_2cc.bigend.vect[0] - local_2cc.smallend.vect[0]) + 1 != (int)lVar29)
                ;
              }
            }
            local_2b0 = CONCAT44(local_2b0._4_4_,(int)local_2b0 + 1);
            lVar19 = local_250;
          }
        }
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

void
MLNodeLaplacian::updateVelocity (const Vector<MultiFab*>& vel, const Vector<MultiFab const*>& sol) const
{
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        const auto& sigma = m_sigma[amrlev][0][0];
        const auto dxinv = m_geom[amrlev][0].InvCellSizeArray();
#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
        const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
        const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
        const MultiFab* intg = m_integral[amrlev].get();
#endif
        for (MFIter mfi(*vel[amrlev], TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& varr = vel[amrlev]->array(mfi);
            Array4<Real const> const& solarr = sol[amrlev]->const_array(mfi);
#ifdef AMREX_USE_EB
            bool regular = !factory;
            if (factory)
            {
                Array4<Real const> const& sigmaarr = sigma->const_array(mfi);
                auto type = (*flags)[mfi].getType(bx);
                Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                Array4<Real const> const& intgarr = intg->const_array(mfi);
                if (type == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, AMREX_SPACEDIM, i, j, k, n,
                    {
                        varr(i,j,k,n) = 0.0;
                    });
                }
                else if (type == FabType::singlevalued)
                {
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_mknewu_eb(i,j,k, varr, solarr, sigmaarr, vfracarr, intgarr, dxinv);
                    });
                }
                else
                {
                    regular = true;
                }
            }
            if (regular)
#endif
            {
                if (sigma) {
                    Array4<Real const> const& sigmaarr = sigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu(i,j,k,varr,solarr,sigmaarr,dxinv,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu(i,j,k,varr,solarr,sigmaarr,dxinv);
                    });
#endif
                } else {
                    Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu_c(i,j,k,varr,solarr,const_sigma,dxinv,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu_c(i,j,k,varr,solarr,const_sigma,dxinv);
                    });
#endif
                }
            }
        }
    }
}